

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O1

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
unsynchronized_pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this,
          Task **ret)

{
  index_t iVar1;
  tagged_index tVar2;
  tagged_index tVar3;
  uint uVar4;
  node *pnVar5;
  bool bVar6;
  byte in_AL;
  uint *puVar7;
  
  do {
    tVar2 = (this->head_)._M_i;
    iVar1 = (index_t)(this->pool).
                     super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                     .node_count_;
    pnVar5 = (this->pool).
             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
             .nodes_;
    puVar7 = (uint *)((long)&(pnVar5->next)._M_i.index + (ulong)(((uint)tVar2 & 0xffff) << 6));
    if (tVar2.index == iVar1) {
      puVar7 = (uint *)0x0;
    }
    tVar3 = (this->tail_)._M_i;
    uVar4 = *puVar7;
    puVar7 = (uint *)((long)&(pnVar5->next)._M_i.index + (ulong)((uVar4 & 0xffff) << 6));
    if ((index_t)uVar4 == iVar1) {
      puVar7 = (uint *)0x0;
    }
    if (tVar2.index == tVar3.index) {
      if (puVar7 == (uint *)0x0) {
        bVar6 = true;
        in_AL = 0;
      }
      else {
        LOCK();
        (this->tail_)._M_i = (tagged_index)((uVar4 & 0xffff) + ((uint)tVar3 & 0xffff0000) + 0x10000)
        ;
        UNLOCK();
LAB_0010bd82:
        bVar6 = false;
      }
    }
    else {
      if (puVar7 == (uint *)0x0) goto LAB_0010bd82;
      *ret = *(Task **)(puVar7 + 2);
      LOCK();
      (this->head_)._M_i = (tagged_index)(((uint)tVar2 & 0xffff0000) + (uVar4 & 0xffff) + 0x10000);
      UNLOCK();
      tVar3 = (this->pool).pool_._M_i;
      *(index_t *)
       ((long)&(((this->pool).
                 super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                .nodes_)->next)._M_i.index + (ulong)(((uint)tVar2 & 0xffff) << 6)) = tVar3.index;
      LOCK();
      (this->pool).pool_._M_i = (tagged_index)((uint)tVar3 & 0xffff0000 | (uint)tVar2 & 0xffff);
      UNLOCK();
      bVar6 = true;
      in_AL = 1;
    }
    if (bVar6) {
      return (bool)(in_AL & 1);
    }
  } while( true );
}

Assistant:

bool unsynchronized_pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_relaxed);
            node * head_ptr = pool.get_pointer(head);
            tagged_node_handle tail = tail_.load(memory_order_relaxed);
            tagged_node_handle next = head_ptr->next.load(memory_order_relaxed);
            node * next_ptr = pool.get_pointer(next);

            if (pool.get_handle(head) == pool.get_handle(tail)) {
                if (next_ptr == 0)
                    return false;

                tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                tail_.store(new_tail);
            } else {
                if (next_ptr == 0)
                    /* this check is not part of the original algorithm as published by michael and scott
                     *
                     * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                     * allocation. we can observe a null-pointer here.
                     * */
                    continue;
                detail::copy_payload(next_ptr->data, ret);
                tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                head_.store(new_head);
                pool.template destruct<false>(head);
                return true;
            }
        }
    }